

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

QList<QCss::StyleRule> * __thiscall
QCss::StyleSelector::styleRulesForNode(StyleSelector *this,NodePtr node)

{
  bool bVar1;
  QMultiMap<unsigned_int,_QCss::StyleRule> *weightedRules_00;
  qsizetype qVar2;
  const_reference this_00;
  long lVar3;
  const_reference pMVar4;
  undefined8 in_RDX;
  StyleSelector *in_RSI;
  StyleRule *in_RDI;
  long in_FS_OFFSET;
  int j;
  int i_3;
  int i_2;
  QString *key;
  int i_1;
  int i;
  StyleSheet *styleSheet;
  int sheetIdx;
  QList<QCss::StyleRule> *rules;
  const_iterator it;
  const_iterator it_2;
  QString name;
  QStringList names;
  const_iterator it_1;
  QStringList ids;
  QMultiMap<unsigned_int,_QCss::StyleRule> weightedRules;
  parameter_type in_stack_fffffffffffffe48;
  QMultiHash<QString,_QCss::StyleRule> *in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  const_iterator *in_stack_fffffffffffffe60;
  bool local_191;
  QList<QCss::StyleRule> *in_stack_fffffffffffffe78;
  StyleRule *rule;
  int local_15c;
  int local_158;
  int local_154;
  NodePtr in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  int local_134;
  const_iterator local_f8;
  const_iterator local_e0 [2];
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  QList<QString> local_90;
  undefined8 local_78;
  const_iterator local_70;
  const_iterator local_58;
  undefined8 local_40;
  QList<QString> local_38;
  undefined8 local_20;
  undefined1 *local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ((DataPointer *)&in_RDI->selectors)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  ((DataPointer *)&in_RDI->selectors)->ptr = (StyleRule *)&DAT_aaaaaaaaaaaaaaaa;
  ((DataPointer *)&in_RDI->selectors)->size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  rule = in_RDI;
  local_10 = in_RDX;
  QList<QCss::StyleRule>::QList((QList<QCss::StyleRule> *)0xa38c8b);
  bVar1 = QList<QCss::StyleSheet>::isEmpty((QList<QCss::StyleSheet> *)0xa38c99);
  if (!bVar1) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    QMultiMap<unsigned_int,_QCss::StyleRule>::QMultiMap
              ((QMultiMap<unsigned_int,_QCss::StyleRule> *)0xa38cd3);
    local_134 = 0;
    while( true ) {
      weightedRules_00 = (QMultiMap<unsigned_int,_QCss::StyleRule> *)(long)local_134;
      qVar2 = QList<QCss::StyleSheet>::size(&in_RSI->styleSheets);
      if (qVar2 <= (long)weightedRules_00) break;
      this_00 = QList<QCss::StyleSheet>::at
                          ((QList<QCss::StyleSheet> *)in_stack_fffffffffffffe50,
                           (qsizetype)in_stack_fffffffffffffe48);
      in_stack_fffffffffffffebc = 0;
      while( true ) {
        in_stack_fffffffffffffe78 = (QList<QCss::StyleRule> *)(long)in_stack_fffffffffffffebc;
        qVar2 = QList<QCss::StyleRule>::size(&this_00->styleRules);
        if (qVar2 <= (long)in_stack_fffffffffffffe78) break;
        local_20 = local_10;
        QList<QCss::StyleRule>::at
                  ((QList<QCss::StyleRule> *)in_stack_fffffffffffffe50,
                   (qsizetype)in_stack_fffffffffffffe48);
        matchRule(in_RSI,in_stack_fffffffffffffeb0,rule,(StyleSheetOrigin)((ulong)in_RDI >> 0x20),
                  (int)in_RDI,weightedRules_00);
        in_stack_fffffffffffffebc = in_stack_fffffffffffffebc + 1;
      }
      bVar1 = QMultiHash<QString,_QCss::StyleRule>::isEmpty(&this_00->idIndex);
      if (!bVar1) {
        local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_38.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_40 = local_10;
        (*in_RSI->_vptr_StyleSelector[5])(&local_38,in_RSI,local_10);
        for (in_stack_fffffffffffffeb8 = 0; lVar3 = (long)in_stack_fffffffffffffeb8,
            qVar2 = QList<QString>::size(&local_38), lVar3 < qVar2;
            in_stack_fffffffffffffeb8 = in_stack_fffffffffffffeb8 + 1) {
          in_stack_fffffffffffffeb0.ptr =
               QList<QString>::at((QList<QString> *)in_stack_fffffffffffffe50,
                                  (qsizetype)in_stack_fffffffffffffe48);
          local_58.i.d = (Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)
                         &DAT_aaaaaaaaaaaaaaaa;
          local_58.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
          local_58.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
          QMultiHash<QString,_QCss::StyleRule>::constFind
                    (in_stack_fffffffffffffe50,(QString *)in_stack_fffffffffffffe48);
          while( true ) {
            QMultiHash<QString,_QCss::StyleRule>::constEnd(in_stack_fffffffffffffe50);
            bVar1 = QMultiHash<QString,_QCss::StyleRule>::const_iterator::operator!=
                              (&local_58,&local_70);
            local_191 = false;
            if (bVar1) {
              QMultiHash<QString,_QCss::StyleRule>::const_iterator::key((const_iterator *)0xa38f13);
              local_191 = ::operator==((QString *)in_stack_fffffffffffffe50,
                                       (QString *)in_stack_fffffffffffffe48);
            }
            if (local_191 == false) break;
            local_78 = local_10;
            QMultiHash<QString,_QCss::StyleRule>::const_iterator::value(&local_58);
            matchRule(in_RSI,in_stack_fffffffffffffeb0,rule,
                      (StyleSheetOrigin)((ulong)in_RDI >> 0x20),(int)in_RDI,weightedRules_00);
            QMultiHash<QString,_QCss::StyleRule>::const_iterator::operator++
                      (in_stack_fffffffffffffe60);
          }
        }
        QList<QString>::~QList((QList<QString> *)0xa38faa);
      }
      bVar1 = QMultiHash<QString,_QCss::StyleRule>::isEmpty(&this_00->nameIndex);
      if (!bVar1) {
        local_90.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_90.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        local_90.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_98 = local_10;
        (*in_RSI->_vptr_StyleSelector[6])(&local_90,in_RSI,local_10);
        local_154 = 0;
        while( true ) {
          in_stack_fffffffffffffe60 = (const_iterator *)(long)local_154;
          qVar2 = QList<QString>::size(&local_90);
          if (qVar2 <= (long)in_stack_fffffffffffffe60) break;
          local_b0 = &DAT_aaaaaaaaaaaaaaaa;
          local_a8 = &DAT_aaaaaaaaaaaaaaaa;
          local_a0 = &DAT_aaaaaaaaaaaaaaaa;
          QList<QString>::at((QList<QString> *)in_stack_fffffffffffffe50,
                             (qsizetype)in_stack_fffffffffffffe48);
          QString::QString((QString *)in_stack_fffffffffffffe50,(QString *)in_stack_fffffffffffffe48
                          );
          if (in_RSI->nameCaseSensitivity == CaseInsensitive) {
            QString::toLower((QString *)in_stack_fffffffffffffe48);
            QString::operator=((QString *)in_stack_fffffffffffffe50,
                               (QString *)in_stack_fffffffffffffe48);
            QString::~QString((QString *)0xa390dc);
          }
          local_e0[0].i.d =
               (Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)&DAT_aaaaaaaaaaaaaaaa;
          local_e0[0].i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
          local_e0[0].e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
          QMultiHash<QString,_QCss::StyleRule>::constFind
                    (in_stack_fffffffffffffe50,(QString *)in_stack_fffffffffffffe48);
          while( true ) {
            QMultiHash<QString,_QCss::StyleRule>::constEnd(in_stack_fffffffffffffe50);
            bVar1 = QMultiHash<QString,_QCss::StyleRule>::const_iterator::operator!=
                              (local_e0,&local_f8);
            in_stack_fffffffffffffe5f = false;
            if (bVar1) {
              QMultiHash<QString,_QCss::StyleRule>::const_iterator::key((const_iterator *)0xa39174);
              in_stack_fffffffffffffe5f =
                   ::operator==((QString *)in_stack_fffffffffffffe50,
                                (QString *)in_stack_fffffffffffffe48);
            }
            if ((bool)in_stack_fffffffffffffe5f == false) break;
            QMultiHash<QString,_QCss::StyleRule>::const_iterator::value(local_e0);
            matchRule(in_RSI,in_stack_fffffffffffffeb0,rule,
                      (StyleSheetOrigin)((ulong)in_RDI >> 0x20),(int)in_RDI,weightedRules_00);
            QMultiHash<QString,_QCss::StyleRule>::const_iterator::operator++
                      (in_stack_fffffffffffffe60);
          }
          QString::~QString((QString *)0xa391fc);
          local_154 = local_154 + 1;
        }
        QList<QString>::~QList((QList<QString> *)0xa39219);
      }
      bVar1 = QString::isEmpty((QString *)0xa39227);
      if (!bVar1) {
        local_158 = 0;
        while( true ) {
          in_stack_fffffffffffffe50 = (QMultiHash<QString,_QCss::StyleRule> *)(long)local_158;
          qVar2 = QList<QCss::MediaRule>::size(&this_00->mediaRules);
          if (qVar2 <= (long)in_stack_fffffffffffffe50) break;
          QList<QCss::MediaRule>::at
                    ((QList<QCss::MediaRule> *)in_stack_fffffffffffffe50,
                     (qsizetype)in_stack_fffffffffffffe48);
          bVar1 = QListSpecialMethods<QString>::contains
                            ((QListSpecialMethods<QString> *)
                             CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                             (QString *)in_stack_fffffffffffffe50,
                             (CaseSensitivity)((ulong)in_stack_fffffffffffffe48 >> 0x20));
          if (bVar1) {
            local_15c = 0;
            while( true ) {
              in_stack_fffffffffffffe48 = (parameter_type)(long)local_15c;
              pMVar4 = QList<QCss::MediaRule>::at
                                 ((QList<QCss::MediaRule> *)in_stack_fffffffffffffe50,
                                  (qsizetype)in_stack_fffffffffffffe48);
              qVar2 = QList<QCss::StyleRule>::size(&pMVar4->styleRules);
              if (qVar2 <= (long)in_stack_fffffffffffffe48) break;
              QList<QCss::MediaRule>::at
                        ((QList<QCss::MediaRule> *)in_stack_fffffffffffffe50,
                         (qsizetype)in_stack_fffffffffffffe48);
              QList<QCss::StyleRule>::at
                        ((QList<QCss::StyleRule> *)in_stack_fffffffffffffe50,
                         (qsizetype)in_stack_fffffffffffffe48);
              matchRule(in_RSI,in_stack_fffffffffffffeb0,rule,
                        (StyleSheetOrigin)((ulong)in_RDI >> 0x20),(int)in_RDI,weightedRules_00);
              local_15c = local_15c + 1;
            }
          }
          local_158 = local_158 + 1;
        }
      }
      local_134 = local_134 + 1;
    }
    QMultiMap<unsigned_int,_QCss::StyleRule>::size
              ((QMultiMap<unsigned_int,_QCss::StyleRule> *)in_stack_fffffffffffffe50);
    QList<QCss::StyleRule>::reserve
              (in_stack_fffffffffffffe78,
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    QMultiMap<unsigned_int,_QCss::StyleRule>::constBegin
              ((QMultiMap<unsigned_int,_QCss::StyleRule> *)in_stack_fffffffffffffe48);
    while( true ) {
      QMultiMap<unsigned_int,_QCss::StyleRule>::constEnd
                ((QMultiMap<unsigned_int,_QCss::StyleRule> *)in_stack_fffffffffffffe48);
      bVar1 = ::operator!=((const_iterator *)in_stack_fffffffffffffe50,
                           (const_iterator *)in_stack_fffffffffffffe48);
      if (!bVar1) break;
      QMultiMap<unsigned_int,_QCss::StyleRule>::const_iterator::operator*
                ((const_iterator *)0xa393e6);
      QList<QCss::StyleRule>::operator+=
                ((QList<QCss::StyleRule> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      QMultiMap<unsigned_int,_QCss::StyleRule>::const_iterator::operator++
                ((const_iterator *)in_stack_fffffffffffffe50);
    }
    QMultiMap<unsigned_int,_QCss::StyleRule>::~QMultiMap
              ((QMultiMap<unsigned_int,_QCss::StyleRule> *)0xa39422);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QList<QCss::StyleRule> *)rule;
  }
  __stack_chk_fail();
}

Assistant:

QList<StyleRule> StyleSelector::styleRulesForNode(NodePtr node)
{
    QList<StyleRule> rules;
    if (styleSheets.isEmpty())
        return rules;

    QMultiMap<uint, StyleRule> weightedRules; // (spec, rule) that will be sorted below

    //prune using indexed stylesheet
    for (int sheetIdx = 0; sheetIdx < styleSheets.size(); ++sheetIdx) {
        const StyleSheet &styleSheet = styleSheets.at(sheetIdx);
        for (int i = 0; i < styleSheet.styleRules.size(); ++i) {
            matchRule(node, styleSheet.styleRules.at(i), styleSheet.origin, styleSheet.depth, &weightedRules);
        }

        if (!styleSheet.idIndex.isEmpty()) {
            QStringList ids = nodeIds(node);
            for (int i = 0; i < ids.size(); i++) {
                const QString &key = ids.at(i);
                QMultiHash<QString, StyleRule>::const_iterator it = styleSheet.idIndex.constFind(key);
                while (it != styleSheet.idIndex.constEnd() && it.key() == key) {
                    matchRule(node, it.value(), styleSheet.origin, styleSheet.depth, &weightedRules);
                    ++it;
                }
            }
        }
        if (!styleSheet.nameIndex.isEmpty()) {
            QStringList names = nodeNames(node);
            for (int i = 0; i < names.size(); i++) {
                QString name = names.at(i);
                if (nameCaseSensitivity == Qt::CaseInsensitive)
                    name = std::move(name).toLower();
                QMultiHash<QString, StyleRule>::const_iterator it = styleSheet.nameIndex.constFind(name);
                while (it != styleSheet.nameIndex.constEnd() && it.key() == name) {
                    matchRule(node, it.value(), styleSheet.origin, styleSheet.depth, &weightedRules);
                    ++it;
                }
            }
        }
        if (!medium.isEmpty()) {
            for (int i = 0; i < styleSheet.mediaRules.size(); ++i) {
                if (styleSheet.mediaRules.at(i).media.contains(medium, Qt::CaseInsensitive)) {
                    for (int j = 0; j < styleSheet.mediaRules.at(i).styleRules.size(); ++j) {
                        matchRule(node, styleSheet.mediaRules.at(i).styleRules.at(j), styleSheet.origin,
                               styleSheet.depth, &weightedRules);
                    }
                }
            }
        }
    }

    rules.reserve(weightedRules.size());
    QMultiMap<uint, StyleRule>::const_iterator it = weightedRules.constBegin();
    for ( ; it != weightedRules.constEnd() ; ++it)
        rules += *it;

    return rules;
}